

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O3

CoreType helics::core::coreTypeFromString(string_view type)

{
  long lVar1;
  char *__n;
  string_view type_00;
  _Alloc_hider _Var2;
  int iVar3;
  CoreType CVar4;
  size_t sVar5;
  const_iterator pvVar6;
  void *in_RSI;
  char *in_RDI;
  size_type sVar7;
  string type2;
  char *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (in_RDI == (char *)0x0) {
    return DEFAULT;
  }
  if (in_RDI[(long)in_RSI + -1] == '_') {
    in_RDI = in_RDI + -1;
  }
  sVar5 = frozen::bits::
          pmh_tables<64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>::
          lookup<std::basic_string_view<char,std::char_traits<char>>,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                    ((pmh_tables<64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                      *)(coreTypes + 0x560),
                     (basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff88,
                     (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     (coreTypes + 0x968));
  __n = *(char **)(coreTypes + sVar5 * 0x18 + 8);
  pcVar8 = in_RDI;
  if (__n == in_RDI) {
    lVar1 = sVar5 * 0x18;
    if (__n == (char *)0x0) {
      if (lVar1 != 0x558) goto LAB_0036121f;
    }
    else {
      iVar3 = bcmp(*(void **)(coreTypes + sVar5 * 0x18 + 0x10),in_RSI,(size_t)__n);
      if (lVar1 != 0x558 && iVar3 == 0) {
LAB_0036121f:
        return *(CoreType *)(coreTypes + lVar1 + 0x18);
      }
    }
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,in_RSI,in_RDI + (long)in_RSI);
  _Var2._M_p = local_68._M_dataplus._M_p;
  if (local_68._M_string_length != 0) {
    sVar7 = 0;
    do {
      iVar3 = tolower((int)_Var2._M_p[sVar7]);
      _Var2._M_p[sVar7] = (byte)iVar3;
      sVar7 = sVar7 + 1;
    } while (local_68._M_string_length != sVar7);
  }
  pvVar6 = frozen::
           unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::CoreType,57ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
           ::
           find<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                     ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::CoreType,57ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                       *)coreTypes,&local_68,
                      (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      (coreTypes + 0x968),
                      (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)coreTypes)
  ;
  if (pvVar6 == (const_iterator)(coreTypes + 0x560)) {
    if ((byte)(*local_68._M_dataplus._M_p | 0x10U) == 0x3d) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_48,&local_68,1,0xffffffffffffffff);
      type_00._M_str = pcVar8;
      type_00._M_len = 0x3611fc;
      CVar4 = coreTypeFromString(type_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xffffffffffffff88,0,5,"zmqss");
      CVar4 = ZMQ_SS;
      if (((iVar3 != 0) &&
          (iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                             ((basic_string_view<char,_std::char_traits<char>_> *)
                              &stack0xffffffffffffff88,0,6,"zmq_ss"), iVar3 != 0)) &&
         (iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &stack0xffffffffffffff88,0,4,"zmq2"), iVar3 != 0)) {
        iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &stack0xffffffffffffff88,0,3,"zmq");
        if (iVar3 == 0) {
          CVar4 = ZMQ;
        }
        else {
          iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &stack0xffffffffffffff88,0,3,"ipc");
          if (iVar3 == 0) {
            CVar4 = INTERPROCESS;
          }
          else {
            iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               &stack0xffffffffffffff88,0,4,"test");
            if (iVar3 == 0) {
              CVar4 = TEST;
            }
            else {
              iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 &stack0xffffffffffffff88,0,5,"tcpss");
              if (iVar3 == 0) {
                CVar4 = TCP_SS;
              }
              else {
                iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   &stack0xffffffffffffff88,0,3,"tcp");
                if (iVar3 == 0) {
                  CVar4 = TCP;
                }
                else {
                  iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     &stack0xffffffffffffff88,0,3,"udp");
                  if (iVar3 == 0) {
                    CVar4 = UDP;
                  }
                  else {
                    iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       &stack0xffffffffffffff88,0,4,"http");
                    if (iVar3 == 0) {
                      CVar4 = HTTP;
                    }
                    else {
                      iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                        ((basic_string_view<char,_std::char_traits<char>_> *)
                                         &stack0xffffffffffffff88,0,3,"mpi");
                      if (iVar3 == 0) {
                        CVar4 = MPI;
                      }
                      else {
                        iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                          ((basic_string_view<char,_std::char_traits<char>_> *)
                                           &stack0xffffffffffffff88,0,6,"inproc");
                        if (iVar3 == 0) {
                          CVar4 = INPROC;
                        }
                        else {
                          iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                  compare((basic_string_view<char,_std::char_traits<char>_> *)
                                          &stack0xffffffffffffff88,0,3,"web");
                          if (iVar3 == 0) {
                            CVar4 = WEBSOCKET;
                          }
                          else {
                            iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                    compare((basic_string_view<char,_std::char_traits<char>_> *)
                                            &stack0xffffffffffffff88,0,4,"null");
                            CVar4 = UNRECOGNIZED;
                            if (iVar3 == 0) {
                              CVar4 = NULLCORE;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    CVar4 = pvVar6->second;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return CVar4;
}

Assistant:

CoreType coreTypeFromString(std::string_view type) noexcept
{
    if (type.empty()) {
        return CoreType::DEFAULT;
    }
    // in case it came from the to_string(CoreType)
    if (type.back() == '_') {
        type.remove_suffix(1);
    }
    const auto* fnd = coreTypes.find(type);
    if (fnd != coreTypes.end()) {
        return fnd->second;
    }
    std::string type2{type};
    std::transform(type2.cbegin(), type2.cend(), type2.begin(), ::tolower);
    fnd = coreTypes.find(type2);
    if (fnd != coreTypes.end()) {
        return fnd->second;
    }
    if ((type2.front() == '=') || (type2.front() == '-')) {
        return coreTypeFromString(type2.substr(1));
    }
    if (type.compare(0, 5, "zmqss") == 0) {
        return CoreType::ZMQ_SS;
    }
    if (type.compare(0, 6, "zmq_ss") == 0) {
        return CoreType::ZMQ_SS;
    }
    if (type.compare(0, 4, "zmq2") == 0) {
        return CoreType::ZMQ_SS;
    }
    if (type.compare(0, 3, "zmq") == 0) {
        return CoreType::ZMQ;
    }
    if (type.compare(0, 3, "ipc") == 0) {
        return CoreType::INTERPROCESS;
    }
    if (type.compare(0, 4, "test") == 0) {
        return CoreType::TEST;
    }
    if (type.compare(0, 5, "tcpss") == 0) {
        return CoreType::TCP_SS;
    }
    if (type.compare(0, 3, "tcp") == 0) {
        return CoreType::TCP;
    }
    if (type.compare(0, 3, "udp") == 0) {
        return CoreType::UDP;
    }
    if (type.compare(0, 4, "http") == 0) {
        return CoreType::HTTP;
    }
    if (type.compare(0, 3, "mpi") == 0) {
        return CoreType::MPI;
    }
    if (type.compare(0, 6, "inproc") == 0) {
        return CoreType::INPROC;
    }
    if (type.compare(0, 3, "web") == 0) {
        return CoreType::WEBSOCKET;
    }
    if (type.compare(0, 4, "null") == 0) {
        return CoreType::NULLCORE;
    }

    return CoreType::UNRECOGNIZED;
}